

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

void __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::iterator::iterator
          (iterator *this,IEnumerable<int_&> *src,bool v)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  
  (this->source).super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_00157638;
  (this->source).state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (src->state).super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (src->state).super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->source).state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->valid = v;
  if (v) {
    (**((this->source).state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->_vptr_IState)();
    iVar2 = (*((this->source).state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    this->valid = SUB41(iVar2,0);
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}